

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMaterial.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Video::~Video(Video *this)

{
  Video *this_local;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Video_0100d228;
  if ((this->content != (uint8_t *)0x0) && (this->content != (uint8_t *)0x0)) {
    operator_delete__(this->content);
  }
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::~shared_ptr(&this->props);
  std::__cxx11::string::~string((string *)&this->fileName);
  std::__cxx11::string::~string((string *)&this->relativeFileName);
  std::__cxx11::string::~string((string *)&this->type);
  FBX::Object::~Object(&this->super_Object);
  return;
}

Assistant:

Video::~Video()
{
    if(content) {
        delete[] content;
    }
}